

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O2

vector<char,_std::allocator<char>_> * __thiscall
cmELFInternalImpl<cmELFTypes64>::EncodeDynamicEntries
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,
          cmELFInternalImpl<cmELFTypes64> *this,DynamicEntryList *entries)

{
  pointer ppVar1;
  ELF_Dyn local_48;
  char local_38 [8];
  
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<char,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,
             (long)(entries->
                   super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(entries->
                   super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                   )._M_impl.super__Vector_impl_data._M_start);
  for (ppVar1 = (entries->
                super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      ppVar1 != (entries->
                super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                )._M_impl.super__Vector_impl_data._M_finish; ppVar1 = ppVar1 + 1) {
    local_48.d_tag = ppVar1->first;
    local_48.d_un = (anon_union_8_2_f9000a74_for_d_un)ppVar1->second;
    if ((this->super_cmELFInternal).NeedSwap == true) {
      ByteSwap(this,&local_48);
    }
    std::vector<char,std::allocator<char>>::insert<char*,void>
              ((vector<char,std::allocator<char>> *)__return_storage_ptr__,
               (const_iterator)
               (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish,(char *)&local_48,local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<char> cmELFInternalImpl<Types>::EncodeDynamicEntries(
  const cmELF::DynamicEntryList& entries)
{
  std::vector<char> result;
  result.reserve(sizeof(ELF_Dyn) * entries.size());

  for (cmELF::DynamicEntryList::const_iterator it = entries.begin();
       it != entries.end(); it++) {
    // Store the entry in an ELF_Dyn, byteswap it, then serialize to chars
    ELF_Dyn dyn;
    dyn.d_tag = static_cast<tagtype>(it->first);
    dyn.d_un.d_val = static_cast<tagtype>(it->second);

    if (this->NeedSwap) {
      ByteSwap(dyn);
    }

    char* pdyn = reinterpret_cast<char*>(&dyn);
    result.insert(result.end(), pdyn, pdyn + sizeof(ELF_Dyn));
  }

  return result;
}